

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFGS.cpp
# Opt level: O1

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::BFGS::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,BFGS *this,
          Problem *P,RealType param_2,DynamicVector<double,_std::allocator<double>_> *oldGradient)

{
  DynamicRectMatrix<double> *m;
  double dVar1;
  double dVar2;
  double **ppdVar3;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  long lVar9;
  uint nrow;
  ulong uVar10;
  long lVar11;
  size_t j_1;
  ulong uVar12;
  ulong uVar13;
  size_t j;
  ulong uVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  DynamicVector<double,_std::allocator<double>_> diffGradientWithHessianApplied;
  allocator_type local_91;
  vector<double,_std::allocator<double>_> local_90;
  DynamicVector<double,_std::allocator<double>_> local_78;
  double local_58;
  double dStack_50;
  DynamicRectMatrix<double> local_40;
  
  m = &this->inverseHessian_;
  if ((this->inverseHessian_).nrow_ == 0) {
    nrow = (uint)((ulong)((long)(P->currentValue_).data_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(P->currentValue_).data_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              ((DynamicRectMatrix<double> *)&local_90,nrow,nrow,0.0);
    OpenMD::DynamicRectMatrix<double>::operator=(&local_40,m);
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
    OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_90);
    lVar9 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar9 != 0) {
      lVar9 = lVar9 >> 3;
      ppdVar3 = m->data_;
      uVar10 = 0;
      do {
        ppdVar3[uVar10 & 0xffffffff][uVar10 & 0xffffffff] = 1.0;
        uVar10 = uVar10 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != uVar10);
    }
  }
  local_78.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict1 *)&local_78,
             &local_91);
  OpenMD::operator-(&local_78,&((this->super_LineSearchBasedMethod).lineSearch_)->gradient_,
                    oldGradient);
  pdVar8 = local_78.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)pdVar5 - (long)pdVar4 >> 3;
  if (pdVar5 != pdVar4) {
    ppdVar3 = m->data_;
    uVar10 = lVar9 + (ulong)(lVar9 == 0);
    uVar12 = 0;
    do {
      pdVar6 = ppdVar3[uVar12 & 0xffffffff];
      pdVar15 = (double *)
                local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
      uVar14 = 0;
      do {
        pdVar15 = (double *)
                  ((double)pdVar15 +
                  pdVar6[uVar14 & 0xffffffff] *
                  local_78.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14]);
        local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar12] = (double)pdVar15;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
  }
  if (pdVar5 == pdVar4) {
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar16 = 0.0;
  }
  else {
    dVar18 = 0.0;
    dVar19 = 0.0;
    lVar11 = 0;
    dVar16 = 0.0;
    dVar17 = 0.0;
    do {
      dVar1 = local_78.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar2 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      dVar18 = dVar18 + dVar2 * dVar1;
      dVar19 = dVar19 + (double)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar11] * dVar1;
      dVar16 = dVar16 + dVar2 * dVar2;
      dVar17 = dVar17 + dVar1 * dVar1;
      lVar11 = lVar11 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
    dVar16 = dVar17 * 1e-08 * dVar16;
  }
  if (dVar16 < 0.0) {
    local_58 = dVar18;
    dStack_50 = dVar19;
    dVar16 = sqrt(dVar16);
    dVar18 = local_58;
    dVar19 = dStack_50;
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  if (dVar16 < dVar18) {
    pdVar4 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)pdVar5 - (long)pdVar4 >> 3;
    if (pdVar5 != pdVar4) {
      pdVar7 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = 0;
      do {
        pdVar8[lVar11] =
             pdVar7[lVar11] * (1.0 / dVar18) +
             (double)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11] * -(1.0 / dVar19);
        lVar11 = lVar11 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
    }
    if (pdVar5 != pdVar4) {
      ppdVar3 = (this->inverseHessian_).data_;
      pdVar4 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar10 = lVar9 + (ulong)(lVar9 == 0);
      uVar12 = 0;
      do {
        pdVar15 = ppdVar3[uVar12 & 0xffffffff];
        uVar14 = 0;
        do {
          uVar13 = uVar14 & 0xffffffff;
          dVar16 = pdVar4[uVar12] * (1.0 / dVar18) * pdVar4[uVar14] + pdVar15[uVar13];
          pdVar15[uVar13] = dVar16;
          dVar16 = (double)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] * -(1.0 / dVar19) *
                   (double)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14] + dVar16;
          pdVar15[uVar13] = dVar16;
          pdVar15[uVar13] = pdVar8[uVar12] * dVar19 * pdVar8[uVar14] + dVar16;
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar10);
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_78);
  lVar9 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    pdVar4 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppdVar3 = (this->inverseHessian_).data_;
    pdVar5 = (((this->super_LineSearchBasedMethod).lineSearch_)->gradient_).data_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar10 = lVar9 + (ulong)(lVar9 == 0);
    uVar12 = 0;
    do {
      pdVar4[uVar12] = 0.0;
      pdVar15 = ppdVar3[uVar12 & 0xffffffff];
      dVar18 = 0.0;
      uVar14 = 0;
      do {
        dVar18 = dVar18 - pdVar15[uVar14 & 0xffffffff] * pdVar5[uVar14];
        pdVar4[uVar12] = dVar18;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
  }
  if ((double **)
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double **)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pdVar8 != (pointer)0x0) {
    operator_delete(pdVar8,(long)local_78.data_.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> BFGS::getUpdatedDirection(
      const Problem& P, RealType, const DynamicVector<RealType>& oldGradient) {
    if (inverseHessian_.getNRow() == 0) {
      // first time in this update, we create needed structures
      inverseHessian_ = DynamicRectMatrix<RealType>(
          P.currentValue().size(), P.currentValue().size(), 0.);
      for (size_t i = 0; i < P.currentValue().size(); ++i)
        inverseHessian_(i, i) = 1.;
    }

    DynamicVector<RealType> diffGradient;
    DynamicVector<RealType> diffGradientWithHessianApplied(
        P.currentValue().size(), 0.);

    diffGradient = lineSearch_->lastGradient() - oldGradient;
    for (size_t i = 0; i < P.currentValue().size(); ++i)
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        diffGradientWithHessianApplied[i] +=
            inverseHessian_(i, j) * diffGradient[j];

    double fac, fae, fad;
    double sumdg, sumxi;

    fac = fae = sumdg = sumxi = 0.;
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      fac += diffGradient[i] * lineSearch_->searchDirection()[i];
      fae += diffGradient[i] * diffGradientWithHessianApplied[i];
      sumdg += std::pow(diffGradient[i], 2.);
      sumxi += std::pow(lineSearch_->searchDirection()[i], 2.);
    }

    if (fac > std::sqrt(1e-8 * sumdg *
                        sumxi))  // skip update if fac not sufficiently positive
    {
      fac = 1.0 / fac;
      fad = 1.0 / fae;

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        diffGradient[i] = fac * lineSearch_->searchDirection()[i] -
                          fad * diffGradientWithHessianApplied[i];

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        for (size_t j = 0; j < P.currentValue().size(); ++j) {
          inverseHessian_(i, j) += fac * lineSearch_->searchDirection()[i] *
                                   lineSearch_->searchDirection()[j];
          inverseHessian_(i, j) -= fad * diffGradientWithHessianApplied[i] *
                                   diffGradientWithHessianApplied[j];
          inverseHessian_(i, j) += fae * diffGradient[i] * diffGradient[j];
        }
    }
    // else
    //  throw "BFGS: FAC not sufficiently positive";

    DynamicVector<RealType> direction(P.currentValue().size());
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      direction[i] = 0.0;
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        direction[i] -= inverseHessian_(i, j) * lineSearch_->lastGradient()[j];
    }

    return direction;
  }